

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O3

int choose_cat_from_present<InputData<float,int>,WorkerMemory<ImputedData<int,double>,double,float>>
              (WorkerMemory<ImputedData<int,_double>,_double,_float> *workspace,
              InputData<float,_int> *input_data,size_t col_num)

{
  pointer pcVar1;
  result_type_conflict rVar2;
  int cat;
  long lVar3;
  int iVar4;
  param_type local_18;
  
  iVar4 = 0;
  local_18 = (param_type)((ulong)((int)workspace->npresent - 1) << 0x20);
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_18,&workspace->rnd_generator,&local_18)
  ;
  workspace->ncat_tried = 0;
  pcVar1 = (workspace->categs).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar3 = 0;
  do {
    if ('\0' < pcVar1[lVar3]) {
      if (iVar4 == rVar2) {
        return (int)lVar3;
      }
      iVar4 = iVar4 + 1;
      workspace->ncat_tried = iVar4;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

int choose_cat_from_present(WorkerMemory &workspace, InputData &input_data, size_t col_num)
{
    int chosen_cat = std::uniform_int_distribution<int>
                                    (0, workspace.npresent - 1)
                                    (workspace.rnd_generator);
    workspace.ncat_tried = 0;
    for (int cat = 0; cat < input_data.ncat[col_num]; cat++)
    {
        if (workspace.categs[cat] > 0)
        {
            if (workspace.ncat_tried == chosen_cat)
                return cat;
            else
                workspace.ncat_tried++;
        }
    }

    unreachable();
    return -1; /* this will never be reached, but CRAN complains otherwise */
}